

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseUser.cpp
# Opt level: O3

void __thiscall BaseUser::setPassword(BaseUser *this,string *_password)

{
  ulong uVar1;
  ulong uVar2;
  
  if (_password->_M_string_length == 0) {
    uVar2 = 0;
  }
  else {
    uVar1 = 0;
    do {
      this->password[uVar1] = (_password->_M_dataplus)._M_p[uVar1];
      uVar1 = uVar1 + 1;
      uVar2 = _password->_M_string_length;
    } while (uVar1 < uVar2);
  }
  this->password[uVar2] = '\0';
  return;
}

Assistant:

void BaseUser::setPassword(const string &_password) {
    for (int i = 0; i < _password.size(); ++i) {
        password[i] = _password[i];
    }
    password[_password.size()] = '\0';
}